

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,size_type n)

{
  ulong uVar1;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar2;
  
  if (this->nStored < n) {
    reserve(this,n);
    uVar1 = this->nStored;
    if (uVar1 <= n && n - uVar1 != 0) {
      paVar2 = &this->field_2;
      if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
           *)this->ptr !=
          (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
           *)0x0) {
        paVar2 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
                  *)this->ptr;
      }
      memset((int *)((long)paVar2 + uVar1 * 4),0,(n - uVar1) * 4);
    }
  }
  this->nStored = n;
  return;
}

Assistant:

void resize(size_type n) {
        if (n < size()) {
            for (size_t i = n; n < size(); ++i)
                alloc.destroy(begin() + i);
        } else if (n > size()) {
            reserve(n);
            for (size_t i = nStored; i < n; ++i)
                alloc.construct(begin() + i);
        }
        nStored = n;
    }